

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O3

STRING_HANDLE Base64_Encode_Internal(uchar *source,size_t size)

{
  undefined1 auVar1 [16];
  char cVar2;
  long lVar3;
  char *pcVar4;
  LOGGER_LOG p_Var5;
  STRING_HANDLE pSVar6;
  int iVar7;
  size_t sVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  size_t __size;
  
  if (size == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = -1;
    if (size < 0xbffffffffffffffe) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = size - 1;
      lVar3 = (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) * 2 + 4;
    }
  }
  __size = 0xffffffffffffffff;
  if (lVar3 + 1U != 0) {
    __size = lVar3 + 1U;
  }
  if (__size == 0xffffffffffffffff) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar4 = "Azure_Base64_Encode:: Invalid size parameter, neededSize:%zu.";
    iVar7 = 0xf9;
    goto LAB_0010e539;
  }
  pcVar4 = (char *)malloc(__size);
  if (pcVar4 == (char *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar4 = "Azure_Base64_Encode:: Allocation failed.";
    iVar7 = 0xff;
    goto LAB_0010e539;
  }
  if (size < 3) {
    uVar10 = 0;
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    sVar8 = size;
    uVar11 = 0;
    do {
      bVar12 = source[lVar3];
      bVar13 = bVar12 >> 2;
      if (bVar12 < 0x68) {
        bVar13 = bVar13 + 0x41;
      }
      else if (bVar12 < 0xd0) {
        bVar13 = bVar13 + 0x47;
      }
      else if (bVar12 < 0xf8) {
        bVar13 = bVar13 - 4;
      }
      else {
        bVar13 = (bVar13 != 0x3e) << 2 | 0x2b;
      }
      bVar12 = (bVar12 & 3) << 4 | source[lVar3 + 1] >> 4;
      if (bVar12 < 0x1a) {
        bVar12 = bVar12 + 0x41;
      }
      else if (bVar12 < 0x34) {
        bVar12 = bVar12 + 0x47;
      }
      else if (bVar12 < 0x3e) {
        bVar12 = bVar12 - 4;
      }
      else {
        bVar12 = (bVar12 != 0x3e) << 2 | 0x2b;
      }
      bVar9 = source[lVar3 + 1] << 2;
      bVar14 = source[lVar3 + 2] >> 6 | bVar9 & 0x3f;
      if (bVar14 < 0x1a) {
        bVar14 = bVar14 + 0x41;
      }
      else if ((bVar9 & 0x3c) < 0x34) {
        bVar14 = bVar14 + 0x47;
      }
      else if (bVar14 < 0x3e) {
        bVar14 = bVar14 - 4;
      }
      else {
        bVar14 = (bVar14 != 0x3e) << 2 | 0x2b;
      }
      bVar9 = source[lVar3 + 2] & 0x3f;
      if (bVar9 < 0x1a) {
        bVar9 = bVar9 + 0x41;
      }
      else if (bVar9 < 0x34) {
        bVar9 = bVar9 + 0x47;
      }
      else if (bVar9 < 0x3e) {
        bVar9 = bVar9 - 4;
      }
      else {
        bVar9 = (bVar9 != 0x3e) << 2 | 0x2b;
      }
      uVar10 = uVar11 + 4;
      if (__size < uVar10) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0010e751;
        iVar7 = 0x11b;
        goto LAB_0010e746;
      }
      lVar3 = lVar3 + 3;
      pcVar4[uVar11] = bVar13;
      pcVar4[uVar11 + 1] = bVar12;
      pcVar4[uVar11 + 2] = bVar14;
      pcVar4[uVar11 + 3] = bVar9;
      sVar8 = sVar8 - 3;
      uVar11 = uVar10;
    } while (2 < sVar8);
  }
  if (size - lVar3 == 1) {
    if (uVar10 + 4 <= __size) {
      bVar12 = source[lVar3];
      bVar13 = bVar12 >> 2;
      if (bVar12 < 0x68) {
        bVar13 = bVar13 + 0x41;
      }
      else if (bVar12 < 0xd0) {
        bVar13 = bVar13 + 0x47;
      }
      else if (bVar12 < 0xf8) {
        bVar13 = bVar13 - 4;
      }
      else {
        bVar13 = (bVar13 != 0x3e) << 2 | 0x2b;
      }
      bVar12 = (byte)(0x77675141 >> ((bVar12 & 3) << 3));
      cVar2 = '=';
LAB_0010e6ff:
      uVar11 = uVar10 + 4;
      pcVar4[uVar10] = bVar13;
      pcVar4[uVar10 + 1] = bVar12;
      pcVar4[uVar10 + 2] = cVar2;
      pcVar4[uVar10 + 3] = '=';
      goto LAB_0010e714;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0010e751;
    iVar7 = 0x13f;
  }
  else {
    uVar11 = uVar10;
    if (size - lVar3 == 2) {
      if (uVar10 + 4 <= __size) {
        bVar12 = source[lVar3];
        bVar13 = bVar12 >> 2;
        if (bVar12 < 0x68) {
          bVar13 = bVar13 + 0x41;
        }
        else if (bVar12 < 0xd0) {
          bVar13 = bVar13 + 0x47;
        }
        else if (bVar12 < 0xf8) {
          bVar13 = bVar13 - 4;
        }
        else {
          bVar13 = (bVar13 != 0x3e) << 2 | 0x2b;
        }
        bVar9 = source[lVar3 + 1];
        bVar12 = (bVar12 & 3) << 4 | bVar9 >> 4;
        if (bVar12 < 0x1a) {
          bVar12 = bVar12 + 0x41;
        }
        else if (bVar12 < 0x34) {
          bVar12 = bVar12 + 0x47;
        }
        else if (bVar12 < 0x3e) {
          bVar12 = bVar12 - 4;
        }
        else {
          bVar12 = (bVar12 != 0x3e) << 2 | 0x2b;
        }
        cVar2 = (char)(*(uint *)(&DAT_00119c80 + (bVar9 & 0xc)) >> ((bVar9 & 3) << 3));
        goto LAB_0010e6ff;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0010e751;
      iVar7 = 0x12a;
    }
    else {
LAB_0010e714:
      if (uVar11 + 1 <= __size) {
        pcVar4[uVar11] = '\0';
        pSVar6 = STRING_new_with_memory(pcVar4);
        if (pSVar6 != (STRING_HANDLE)0x0) {
          return pSVar6;
        }
        free(pcVar4);
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) {
          return (STRING_HANDLE)0x0;
        }
        pcVar4 = "Azure_Base64_Encode:: Allocation failed for return value.";
        iVar7 = 0x167;
LAB_0010e539:
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                  ,"Base64_Encode_Internal",iVar7,1,pcVar4);
        return (STRING_HANDLE)0x0;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0010e751;
      iVar7 = 0x152;
    }
  }
LAB_0010e746:
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
            ,"Base64_Encode_Internal",iVar7,1,"Azure_Base64_Encode:: Invalid buffer size.");
LAB_0010e751:
  free(pcVar4);
  return (STRING_HANDLE)0x0;
}

Assistant:

static STRING_HANDLE Base64_Encode_Internal(const unsigned char* source, size_t size)
{
    STRING_HANDLE result;
    size_t neededSize = 0;
    bool isBufferOverflow = false;
    char* encoded;
    size_t currentPosition = 0;
    neededSize = safe_add_size_t(neededSize, (size == 0) ? (0) : safe_multiply_size_t(safe_add_size_t(((safe_subtract_size_t(size, 1)) / 3), 1), 4));
    neededSize = safe_add_size_t(neededSize, 1);  /*+1 because \0 at the end of the string*/

    if (neededSize == 0 || neededSize == SIZE_MAX)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: Invalid size parameter, neededSize:%zu.", neededSize);
    }
    /*Codes_SRS_BASE64_06_006: [If when allocating memory to produce the encoding a failure occurs then Azure_Base64_Encode shall return NULL.]*/
    else if ((encoded = (char*)malloc(neededSize)) == NULL)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: Allocation failed.");
    }
    else
    {
        /*b0            b1(+1)          b2(+2)
        7 6 5 4 3 2 1 0 7 6 5 4 3 2 1 0 7 6 5 4 3 2 1 0
        |----c1---| |----c2---| |----c3---| |----c4---|
        */

        size_t destinationPosition = 0;
        while (size - currentPosition >= 3)
        {
            char c1 = base64char(source[currentPosition] >> 2);
            char c2 = base64char(
                ((source[currentPosition] & 3) << 4) |
                    (source[currentPosition + 1] >> 4)
            );
            char c3 = base64char(
                ((source[currentPosition + 1] & 0x0F) << 2) |
                    ((source[currentPosition + 2] >> 6) & 3)
            );
            char c4 = base64char(
                source[currentPosition + 2] & 0x3F
            );
            currentPosition += 3;

            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
                break;
            }
            encoded[destinationPosition++] = c1;
            encoded[destinationPosition++] = c2;
            encoded[destinationPosition++] = c3;
            encoded[destinationPosition++] = c4;

        }

        if (!isBufferOverflow && size - currentPosition == 2)
        {
            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                char c1 = base64char(source[currentPosition] >> 2);
                char c2 = base64char(
                    ((source[currentPosition] & 0x03) << 4) |
                    (source[currentPosition + 1] >> 4)
                );
                char c3 = base64b16(source[currentPosition + 1] & 0x0F);
                encoded[destinationPosition++] = c1;
                encoded[destinationPosition++] = c2;
                encoded[destinationPosition++] = c3;
                encoded[destinationPosition++] = '=';
            }
        }
        else if (!isBufferOverflow && size - currentPosition == 1)
        {
            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                char c1 = base64char(source[currentPosition] >> 2);
                char c2 = base64b8(source[currentPosition] & 0x03);
                encoded[destinationPosition++] = c1;
                encoded[destinationPosition++] = c2;
                encoded[destinationPosition++] = '=';
                encoded[destinationPosition++] = '=';
            }
        }

        /*null terminating the string*/
        if (!isBufferOverflow)
        {
            if ((destinationPosition + 1) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                encoded[destinationPosition] = '\0';
            }
        }

        if (isBufferOverflow)
        {
            free(encoded);
            result = NULL;
        }
        else
        {
            /*Codes_SRS_BASE64_06_007: [Otherwise Azure_Base64_Encode shall return a pointer to STRING, that string contains the base 64 encoding of input.]*/
            result = STRING_new_with_memory(encoded);
            if (result == NULL)
            {
                free(encoded);
                LogError("Azure_Base64_Encode:: Allocation failed for return value.");
            }
        }
    }
    return result;
}